

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O1

void __thiscall FTagManager::AddSectorTag(FTagManager *this,int sector,int tag)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  FTagItem *pFVar4;
  uint i;
  uint uVar5;
  ulong uVar6;
  int *piVar7;
  bool bVar8;
  
  if (tag != 0) {
    if ((this->startForSector).Count <= (uint)sector) {
      do {
        TArray<int,_int>::Grow(&this->startForSector,1);
        (this->startForSector).Array[(this->startForSector).Count] = -1;
        uVar5 = (this->startForSector).Count + 1;
        (this->startForSector).Count = uVar5;
      } while (uVar5 <= (uint)sector);
    }
    piVar7 = (this->startForSector).Array;
    uVar5 = piVar7[sector];
    uVar6 = (ulong)uVar5;
    uVar2 = (this->allTags).Count;
    if (uVar6 == 0xffffffff) {
      piVar7[sector] = uVar2;
    }
    else {
      bVar8 = uVar5 < uVar2;
      if (bVar8) {
        pFVar4 = (this->allTags).Array;
        if (pFVar4[uVar6].tag != tag) {
          piVar7 = &pFVar4[uVar6 + 1].tag;
          do {
            if (uVar2 - 1 == (int)uVar6) goto LAB_004588d9;
            uVar5 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar5;
            iVar3 = *piVar7;
            piVar7 = piVar7 + 3;
          } while (iVar3 != tag);
          bVar8 = uVar5 < uVar2;
        }
        if (bVar8) {
          return;
        }
      }
    }
LAB_004588d9:
    TArray<FTagItem,_FTagItem>::Grow(&this->allTags,1);
    pFVar4 = (this->allTags).Array;
    uVar5 = (this->allTags).Count;
    pFVar4[uVar5].target = sector;
    pFVar4[uVar5].tag = tag;
    pFVar4[uVar5].nexttag = -1;
    puVar1 = &(this->allTags).Count;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void FTagManager::AddSectorTag(int sector, int tag)
{
	if (tag == 0) return;

	// This function assumes that all tags for a single sector get added sequentially.
	// Should there ever be some need for compatibility.txt to add tags to sectors which already have a tag this function needs to be changed to adjust the startForSector indices.
	while (startForSector.Size() <= (unsigned int)sector)
	{
		startForSector.Push(-1);
	}
	if (startForSector[sector] == -1)
	{
		startForSector[sector] = allTags.Size();
	}
	else
	{
		// check if the key was already defined
		for (unsigned i = startForSector[sector]; i < allTags.Size(); i++)
		{
			if (allTags[i].tag == tag)
			{
				return;
			}
		}
	}
	FTagItem it = { sector, tag, -1 };
	allTags.Push(it);
}